

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int amqpvalue_get_header(AMQP_VALUE value,HEADER_HANDLE *header_handle)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE pAVar3;
  uint32_t local_50;
  _Bool local_49;
  uint32_t delivery_count;
  uchar local_42;
  _Bool first_acquirer;
  milliseconds ttl;
  uint8_t priority;
  _Bool durable;
  AMQP_VALUE item_value;
  AMQP_VALUE pAStack_30;
  uint32_t list_item_count;
  AMQP_VALUE list_value;
  HEADER_INSTANCE *header_instance;
  HEADER_HANDLE *ppHStack_18;
  int result;
  HEADER_HANDLE *header_handle_local;
  AMQP_VALUE value_local;
  
  ppHStack_18 = header_handle;
  header_handle_local = (HEADER_HANDLE *)value;
  list_value = (AMQP_VALUE)header_create_internal();
  *ppHStack_18 = (HEADER_HANDLE)list_value;
  if (*ppHStack_18 == (HEADER_HANDLE)0x0) {
    header_instance._4_4_ = 0x390a;
  }
  else {
    pAStack_30 = amqpvalue_get_inplace_described_value((AMQP_VALUE)header_handle_local);
    if (pAStack_30 == (AMQP_VALUE)0x0) {
      header_destroy(*ppHStack_18);
      header_instance._4_4_ = 0x3912;
    }
    else {
      iVar1 = amqpvalue_get_list_item_count(pAStack_30,(uint32_t *)((long)&item_value + 4));
      if (iVar1 == 0) {
        if ((item_value._4_4_ != 0) &&
           (_ttl = amqpvalue_get_list_item(pAStack_30,0), _ttl != (AMQP_VALUE)0x0)) {
          AVar2 = amqpvalue_get_type(_ttl);
          if ((AVar2 != AMQP_TYPE_NULL) &&
             (iVar1 = amqpvalue_get_boolean(_ttl,&first_acquirer), iVar1 != 0)) {
            amqpvalue_destroy(_ttl);
            header_destroy(*ppHStack_18);
            return 0x3935;
          }
          amqpvalue_destroy(_ttl);
        }
        if ((1 < item_value._4_4_) &&
           (_ttl = amqpvalue_get_list_item(pAStack_30,1), _ttl != (AMQP_VALUE)0x0)) {
          AVar2 = amqpvalue_get_type(_ttl);
          if ((AVar2 != AMQP_TYPE_NULL) && (iVar1 = amqpvalue_get_ubyte(_ttl,&local_42), iVar1 != 0)
             ) {
            amqpvalue_destroy(_ttl);
            header_destroy(*ppHStack_18);
            return 0x3952;
          }
          amqpvalue_destroy(_ttl);
        }
        if ((2 < item_value._4_4_) &&
           (_ttl = amqpvalue_get_list_item(pAStack_30,2), _ttl != (AMQP_VALUE)0x0)) {
          AVar2 = amqpvalue_get_type(_ttl);
          if ((AVar2 != AMQP_TYPE_NULL) &&
             (iVar1 = amqpvalue_get_uint(_ttl,&delivery_count), iVar1 != 0)) {
            amqpvalue_destroy(_ttl);
            header_destroy(*ppHStack_18);
            return 0x396f;
          }
          amqpvalue_destroy(_ttl);
        }
        if ((3 < item_value._4_4_) &&
           (_ttl = amqpvalue_get_list_item(pAStack_30,3), _ttl != (AMQP_VALUE)0x0)) {
          AVar2 = amqpvalue_get_type(_ttl);
          if ((AVar2 != AMQP_TYPE_NULL) &&
             (iVar1 = amqpvalue_get_boolean(_ttl,&local_49), iVar1 != 0)) {
            amqpvalue_destroy(_ttl);
            header_destroy(*ppHStack_18);
            return 0x398c;
          }
          amqpvalue_destroy(_ttl);
        }
        if ((4 < item_value._4_4_) &&
           (_ttl = amqpvalue_get_list_item(pAStack_30,4), _ttl != (AMQP_VALUE)0x0)) {
          AVar2 = amqpvalue_get_type(_ttl);
          if ((AVar2 != AMQP_TYPE_NULL) && (iVar1 = amqpvalue_get_uint(_ttl,&local_50), iVar1 != 0))
          {
            amqpvalue_destroy(_ttl);
            header_destroy(*ppHStack_18);
            return 0x39a9;
          }
          amqpvalue_destroy(_ttl);
        }
        pAVar3 = amqpvalue_clone((AMQP_VALUE)header_handle_local);
        *(AMQP_VALUE *)list_value = pAVar3;
        header_instance._4_4_ = 0;
      }
      else {
        header_instance._4_4_ = 0x3919;
      }
    }
  }
  return header_instance._4_4_;
}

Assistant:

int amqpvalue_get_header(AMQP_VALUE value, HEADER_HANDLE* header_handle)
{
    int result;
    HEADER_INSTANCE* header_instance = (HEADER_INSTANCE*)header_create_internal();
    *header_handle = header_instance;
    if (*header_handle == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE list_value = amqpvalue_get_inplace_described_value(value);
        if (list_value == NULL)
        {
            header_destroy(*header_handle);
            result = MU_FAILURE;
        }
        else
        {
            uint32_t list_item_count;
            if (amqpvalue_get_list_item_count(list_value, &list_item_count) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                do
                {
                    AMQP_VALUE item_value;
                    /* durable */
                    if (list_item_count > 0)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 0);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                bool durable;
                                if (amqpvalue_get_boolean(item_value, &durable) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    header_destroy(*header_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* priority */
                    if (list_item_count > 1)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 1);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                uint8_t priority;
                                if (amqpvalue_get_ubyte(item_value, &priority) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    header_destroy(*header_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* ttl */
                    if (list_item_count > 2)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 2);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                milliseconds ttl;
                                if (amqpvalue_get_milliseconds(item_value, &ttl) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    header_destroy(*header_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* first-acquirer */
                    if (list_item_count > 3)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 3);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                bool first_acquirer;
                                if (amqpvalue_get_boolean(item_value, &first_acquirer) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    header_destroy(*header_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* delivery-count */
                    if (list_item_count > 4)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 4);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                uint32_t delivery_count;
                                if (amqpvalue_get_uint(item_value, &delivery_count) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    header_destroy(*header_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }

                    header_instance->composite_value = amqpvalue_clone(value);

                    result = 0;
                } while(0);
            }
        }
    }

    return result;
}